

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O0

void __thiscall rudp::rudp_server::disconnect(rudp_server *this,uint32_t session_id)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  element_type *this_00;
  bool local_41;
  _Self local_38;
  _Self local_30;
  iterator sess;
  _Self local_20;
  iterator endpoint;
  uint32_t session_id_local;
  rudp_server *this_local;
  
  endpoint._M_node._4_4_ = session_id;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       ::find(&this->session_bindings,(key_type *)((long)&endpoint._M_node + 4));
  sess._M_node = (_Base_ptr)
                 std::
                 map<unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 ::end(&this->session_bindings);
  bVar1 = std::operator!=(&local_20,(_Self *)&sess);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ::operator->(&local_20);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
         ::find(&this->sessions,&ppVar2->second);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
         ::end(&this->sessions);
    bVar1 = std::operator!=(&local_30,&local_38);
    local_41 = false;
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>
               ::operator->(&local_30);
      local_41 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ppVar3->second);
    }
    if (local_41 != false) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>
               ::operator->(&local_30);
      this_00 = std::__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar3->second);
      session::disconnect(this_00);
    }
  }
  return;
}

Assistant:

void disconnect( uint32_t session_id ) {
    auto endpoint = session_bindings.find( session_id );
    if( endpoint != session_bindings.end() ) {
      auto sess = sessions.find( endpoint->second );
      if( sess != sessions.end() && sess->second )
        sess->second->disconnect();
    }
  }